

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBitPatterns.cpp
# Opt level: O2

void testBitPatterns(void)

{
  std::operator<<((ostream *)&std::cout,"specific bit patterns\n\n");
  anon_unknown.dwarf_f7613::testBits(1.0,"0 01111 0000000000","0 01111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (1.0009766,"0 01111 0000000001","0 01111111 00000000010000000000000");
  anon_unknown.dwarf_f7613::testBits
            (1.0004883,"0 01111 0000000000","0 01111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (1.0004882,"0 01111 0000000000","0 01111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (1.0004884,"0 01111 0000000001","0 01111111 00000000010000000000000");
  anon_unknown.dwarf_f7613::testBits
            (1.0019531,"0 01111 0000000010","0 01111111 00000000100000000000000");
  anon_unknown.dwarf_f7613::testBits
            (1.0014648,"0 01111 0000000010","0 01111111 00000000100000000000000");
  anon_unknown.dwarf_f7613::testBits
            (1.0014647,"0 01111 0000000001","0 01111111 00000000010000000000000");
  anon_unknown.dwarf_f7613::testBits
            (1.001465,"0 01111 0000000010","0 01111111 00000000100000000000000");
  anon_unknown.dwarf_f7613::testBits
            (0.9995117,"0 01110 1111111111","0 01111110 11111111110000000000000");
  anon_unknown.dwarf_f7613::testBits
            (0.99975586,"0 01111 0000000000","0 01111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (0.9997559,"0 01111 0000000000","0 01111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (0.9997558,"0 01110 1111111111","0 01111110 11111111110000000000000");
  anon_unknown.dwarf_f7613::testBits
            (5.9604645e-08,"0 00000 0000000001","0 01100111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (1.1920929e-07,"0 00000 0000000010","0 01101000 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (8.940697e-08,"0 00000 0000000010","0 01101000 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (8.9401006e-08,"0 00000 0000000001","0 01100111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (8.941293e-08,"0 00000 0000000010","0 01101000 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits(0.0,"0 00000 0000000000","0 00000000 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (2.9802322e-08,"0 00000 0000000000","0 00000000 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (2.9808284e-08,"0 00000 0000000001","0 01100111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (2.9796361e-08,"0 00000 0000000000","0 00000000 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (6.1035156e-05,"0 00001 0000000000","0 01110001 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (6.109476e-05,"0 00001 0000000001","0 01110001 00000000010000000000000");
  anon_unknown.dwarf_f7613::testBits
            (6.106496e-05,"0 00001 0000000000","0 01110001 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (6.106495e-05,"0 00001 0000000000","0 01110001 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (6.1064966e-05,"0 00001 0000000001","0 01110001 00000000010000000000000");
  anon_unknown.dwarf_f7613::testBits
            (6.097555e-05,"0 00000 1111111111","0 01110000 11111111100000000000000");
  anon_unknown.dwarf_f7613::testBits
            (6.1005354e-05,"0 00001 0000000000","0 01110001 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (6.1005358e-05,"0 00001 0000000000","0 01110001 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (6.100535e-05,"0 00000 1111111111","0 01110000 11111111100000000000000");
  anon_unknown.dwarf_f7613::testBits(2.0,"0 10000 0000000000","0 10000000 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits(3.0,"0 10000 1000000000","0 10000000 10000000000000000000000");
  anon_unknown.dwarf_f7613::testBits(10.0,"0 10010 0100000000","0 10000010 01000000000000000000000")
  ;
  anon_unknown.dwarf_f7613::testBits(0.1,"0 01011 1001100110","0 01111011 10011001100000000000000");
  anon_unknown.dwarf_f7613::testBits(0.2,"0 01100 1001100110","0 01111100 10011001100000000000000");
  anon_unknown.dwarf_f7613::testBits(0.3,"0 01101 0011001101","0 01111101 00110011010000000000000");
  anon_unknown.dwarf_f7613::testBits
            (65504.0,"0 11110 1111111111","0 10001110 11111111110000000000000");
  anon_unknown.dwarf_f7613::testBits
            (65536.0,"0 11111 0000000000","0 11111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (65520.0,"0 11111 0000000000","0 11111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (65519.996,"0 11110 1111111111","0 10001110 11111111110000000000000");
  anon_unknown.dwarf_f7613::testBits
            (65520.004,"0 11111 0000000000","0 11111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (4.290774e+09,"0 11111 0000000000","0 11111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (3.4028235e+38,"0 11111 0000000000","0 11111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (INFINITY,"0 11111 0000000000","0 11111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits(NAN,"0 11111 1111111111","0 11111111 11111111110000000000000");
  anon_unknown.dwarf_f7613::testBits(NAN,"0 11111 1010101010","0 11111111 10101010100000000000000");
  anon_unknown.dwarf_f7613::testBits(-1.0,"1 01111 0000000000","1 01111111 00000000000000000000000")
  ;
  anon_unknown.dwarf_f7613::testBits
            (-1.0009766,"1 01111 0000000001","1 01111111 00000000010000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-1.0004883,"1 01111 0000000000","1 01111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-1.0004882,"1 01111 0000000000","1 01111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-1.0004884,"1 01111 0000000001","1 01111111 00000000010000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-1.0019531,"1 01111 0000000010","1 01111111 00000000100000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-1.0014648,"1 01111 0000000010","1 01111111 00000000100000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-1.0014647,"1 01111 0000000001","1 01111111 00000000010000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-1.001465,"1 01111 0000000010","1 01111111 00000000100000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-0.9995117,"1 01110 1111111111","1 01111110 11111111110000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-0.99975586,"1 01111 0000000000","1 01111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-0.9997559,"1 01111 0000000000","1 01111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-0.9997558,"1 01110 1111111111","1 01111110 11111111110000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-5.9604645e-08,"1 00000 0000000001","1 01100111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-1.1920929e-07,"1 00000 0000000010","1 01101000 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-8.940697e-08,"1 00000 0000000010","1 01101000 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-8.9401006e-08,"1 00000 0000000001","1 01100111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-8.941293e-08,"1 00000 0000000010","1 01101000 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits(-0.0,"X 00000 0000000000","X 00000000 00000000000000000000000")
  ;
  anon_unknown.dwarf_f7613::testBits
            (-2.9802322e-08,"1 00000 0000000000","1 00000000 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-2.9808284e-08,"1 00000 0000000001","1 01100111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-2.9796361e-08,"1 00000 0000000000","1 00000000 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-6.1035156e-05,"1 00001 0000000000","1 01110001 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-6.109476e-05,"1 00001 0000000001","1 01110001 00000000010000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-6.106496e-05,"1 00001 0000000000","1 01110001 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-6.106495e-05,"1 00001 0000000000","1 01110001 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-6.1064966e-05,"1 00001 0000000001","1 01110001 00000000010000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-6.097555e-05,"1 00000 1111111111","1 01110000 11111111100000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-6.1005354e-05,"1 00001 0000000000","1 01110001 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-6.1005358e-05,"1 00001 0000000000","1 01110001 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-6.100535e-05,"1 00000 1111111111","1 01110000 11111111100000000000000");
  anon_unknown.dwarf_f7613::testBits(-2.0,"1 10000 0000000000","1 10000000 00000000000000000000000")
  ;
  anon_unknown.dwarf_f7613::testBits(-3.0,"1 10000 1000000000","1 10000000 10000000000000000000000")
  ;
  anon_unknown.dwarf_f7613::testBits
            (-10.0,"1 10010 0100000000","1 10000010 01000000000000000000000");
  anon_unknown.dwarf_f7613::testBits(-0.1,"1 01011 1001100110","1 01111011 10011001100000000000000")
  ;
  anon_unknown.dwarf_f7613::testBits(-0.2,"1 01100 1001100110","1 01111100 10011001100000000000000")
  ;
  anon_unknown.dwarf_f7613::testBits(-0.3,"1 01101 0011001101","1 01111101 00110011010000000000000")
  ;
  anon_unknown.dwarf_f7613::testBits
            (-65504.0,"1 11110 1111111111","1 10001110 11111111110000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-65536.0,"1 11111 0000000000","1 11111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-65520.0,"1 11111 0000000000","1 11111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-65519.996,"1 11110 1111111111","1 10001110 11111111110000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-65520.004,"1 11111 0000000000","1 11111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-4.290774e+09,"1 11111 0000000000","1 11111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-3.4028235e+38,"1 11111 0000000000","1 11111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits
            (-INFINITY,"1 11111 0000000000","1 11111111 00000000000000000000000");
  anon_unknown.dwarf_f7613::testBits(-NAN,"1 11111 1111111111","1 11111111 11111111110000000000000")
  ;
  anon_unknown.dwarf_f7613::testBits(-NAN,"1 11111 1010101010","1 11111111 10101010100000000000000")
  ;
  std::operator<<((ostream *)&std::cout,"ok\n\n");
  std::ostream::flush();
  return;
}

Assistant:

void
testBitPatterns ()
{
    cout << "specific bit patterns\n\n";

    //
    // Numbers close to 1.0
    //

    testBits (1.0f, "0 01111 0000000000", "0 01111111 00000000000000000000000");
    testBits (
        1.0f + HALF_EPSILON,
        "0 01111 0000000001",
        "0 01111111 00000000010000000000000");
    testBits (
        1.0f + HALF_EPSILON * 0.5f,
        "0 01111 0000000000",
        "0 01111111 00000000000000000000000");
    testBits (
        1.0f + HALF_EPSILON * 0.4999f,
        "0 01111 0000000000",
        "0 01111111 00000000000000000000000");
    testBits (
        1.0f + HALF_EPSILON * 0.5001f,
        "0 01111 0000000001",
        "0 01111111 00000000010000000000000");
    testBits (
        1.0f + HALF_EPSILON + HALF_EPSILON,
        "0 01111 0000000010",
        "0 01111111 00000000100000000000000");
    testBits (
        1.0f + HALF_EPSILON + HALF_EPSILON * 0.5f,
        "0 01111 0000000010",
        "0 01111111 00000000100000000000000");
    testBits (
        1.0f + HALF_EPSILON + HALF_EPSILON * 0.4999f,
        "0 01111 0000000001",
        "0 01111111 00000000010000000000000");
    testBits (
        1.0f + HALF_EPSILON + HALF_EPSILON * 0.5001f,
        "0 01111 0000000010",
        "0 01111111 00000000100000000000000");
    testBits (
        1.0f - HALF_EPSILON * 0.5f,
        "0 01110 1111111111",
        "0 01111110 11111111110000000000000");
    testBits (
        1.0f - HALF_EPSILON * 0.5f * 0.5f,
        "0 01111 0000000000",
        "0 01111111 00000000000000000000000");
    testBits (
        1.0f - HALF_EPSILON * 0.5f * 0.4999f,
        "0 01111 0000000000",
        "0 01111111 00000000000000000000000");
    testBits (
        1.0f - HALF_EPSILON * 0.5f * 0.5001f,
        "0 01110 1111111111",
        "0 01111110 11111111110000000000000");

    //
    // Numbers close to HALF_DENORM_MIN
    //

    testBits (
        HALF_DENORM_MIN,
        "0 00000 0000000001",
        "0 01100111 00000000000000000000000");
    testBits (
        HALF_DENORM_MIN + HALF_DENORM_MIN,
        "0 00000 0000000010",
        "0 01101000 00000000000000000000000");
    testBits (
        HALF_DENORM_MIN + HALF_DENORM_MIN * 0.5f,
        "0 00000 0000000010",
        "0 01101000 00000000000000000000000");
    testBits (
        HALF_DENORM_MIN + HALF_DENORM_MIN * 0.4999f,
        "0 00000 0000000001",
        "0 01100111 00000000000000000000000");
    testBits (
        HALF_DENORM_MIN + HALF_DENORM_MIN * 0.5001f,
        "0 00000 0000000010",
        "0 01101000 00000000000000000000000");
    testBits (
        HALF_DENORM_MIN -
            HALF_DENORM_MIN, // NOSONAR - suppress SonarCloud bug report.
        "0 00000 0000000000",
        "0 00000000 00000000000000000000000");
    testBits (
        HALF_DENORM_MIN - HALF_DENORM_MIN * 0.5f,
        "0 00000 0000000000",
        "0 00000000 00000000000000000000000");
    testBits (
        HALF_DENORM_MIN - HALF_DENORM_MIN * 0.4999f,
        "0 00000 0000000001",
        "0 01100111 00000000000000000000000");
    testBits (
        HALF_DENORM_MIN - HALF_DENORM_MIN * 0.5001f,
        "0 00000 0000000000",
        "0 00000000 00000000000000000000000");

    //
    // Numbers close to HALF_NRM_MIN
    //

    testBits (
        HALF_NRM_MIN,
        "0 00001 0000000000",
        "0 01110001 00000000000000000000000");
    testBits (
        HALF_NRM_MIN + HALF_DENORM_MIN,
        "0 00001 0000000001",
        "0 01110001 00000000010000000000000");
    testBits (
        HALF_NRM_MIN + HALF_DENORM_MIN * 0.5f,
        "0 00001 0000000000",
        "0 01110001 00000000000000000000000");
    testBits (
        HALF_NRM_MIN + HALF_DENORM_MIN * 0.4999f,
        "0 00001 0000000000",
        "0 01110001 00000000000000000000000");
    testBits (
        HALF_NRM_MIN + HALF_DENORM_MIN * 0.5001f,
        "0 00001 0000000001",
        "0 01110001 00000000010000000000000");
    testBits (
        HALF_NRM_MIN - HALF_DENORM_MIN,
        "0 00000 1111111111",
        "0 01110000 11111111100000000000000");
    testBits (
        HALF_NRM_MIN - HALF_DENORM_MIN * 0.5f,
        "0 00001 0000000000",
        "0 01110001 00000000000000000000000");
    testBits (
        HALF_NRM_MIN - HALF_DENORM_MIN * 0.49995f,
        "0 00001 0000000000",
        "0 01110001 00000000000000000000000");
    testBits (
        HALF_NRM_MIN - HALF_DENORM_MIN * 0.50005f,
        "0 00000 1111111111",
        "0 01110000 11111111100000000000000");

    //
    // Small positive integers and simple decimal fractions
    //

    testBits (2, "0 10000 0000000000", "0 10000000 00000000000000000000000");
    testBits (3, "0 10000 1000000000", "0 10000000 10000000000000000000000");
    testBits (10, "0 10010 0100000000", "0 10000010 01000000000000000000000");
    testBits (0.1f, "0 01011 1001100110", "0 01111011 10011001100000000000000");
    testBits (0.2f, "0 01100 1001100110", "0 01111100 10011001100000000000000");
    testBits (0.3f, "0 01101 0011001101", "0 01111101 00110011010000000000000");

    //
    // Numbers close to HALF_MAX
    //

    testBits (
        HALF_MAX, "0 11110 1111111111", "0 10001110 11111111110000000000000");
    testBits (
        (1 << HALF_MAX_EXP) * 1.0,
        "0 11111 0000000000",                  // +infinity
        "0 11111111 00000000000000000000000"); // +infinity
    testBits (
        (1 << HALF_MAX_EXP) * (1.0f - HALF_EPSILON * 0.25f),
        "0 11111 0000000000",                  // +infinity
        "0 11111111 00000000000000000000000"); // +infinity
    testBits (
        (1 << HALF_MAX_EXP) * (1.0f - HALF_EPSILON * 0.25005f),
        "0 11110 1111111111",
        "0 10001110 11111111110000000000000");
    testBits (
        (1 << HALF_MAX_EXP) * (1.0f - HALF_EPSILON * 0.24995f),
        "0 11111 0000000000",                  // +infinity
        "0 11111111 00000000000000000000000"); // +infinity

    //
    // Large positive numbers, positive infinity and NANs
    //

    testBits (
        HALF_MAX * HALF_MAX,
        "0 11111 0000000000",                  // +infinity
        "0 11111111 00000000000000000000000"); // +infinity
    testBits (
        FLT_MAX,
        "0 11111 0000000000",                  // +infinity
        "0 11111111 00000000000000000000000"); // +infinity
    testBits (
        floatPosInfinity (),
        "0 11111 0000000000",                  // +infinity
        "0 11111111 00000000000000000000000"); // +infinity
    testBits (
        floatPosQNan1 (),
        "0 11111 1111111111",                  // nan
        "0 11111111 11111111110000000000000"); // nan
    testBits (
        floatPosQNan2 (),
        "0 11111 1010101010",                  // nan
        "0 11111111 10101010100000000000000"); // nan

    //
    // Numbers close to -1.0
    //

    testBits (-1.0, "1 01111 0000000000", "1 01111111 00000000000000000000000");
    testBits (
        -(1.0f + HALF_EPSILON),
        "1 01111 0000000001",
        "1 01111111 00000000010000000000000");
    testBits (
        -(1.0f + HALF_EPSILON * 0.5f),
        "1 01111 0000000000",
        "1 01111111 00000000000000000000000");
    testBits (
        -(1.0f + HALF_EPSILON * 0.4999f),
        "1 01111 0000000000",
        "1 01111111 00000000000000000000000");
    testBits (
        -(1.0f + HALF_EPSILON * 0.5001f),
        "1 01111 0000000001",
        "1 01111111 00000000010000000000000");
    testBits (
        -(1.0f + HALF_EPSILON + HALF_EPSILON),
        "1 01111 0000000010",
        "1 01111111 00000000100000000000000");
    testBits (
        -(1.0f + HALF_EPSILON + HALF_EPSILON * 0.5f),
        "1 01111 0000000010",
        "1 01111111 00000000100000000000000");
    testBits (
        -(1.0f + HALF_EPSILON + HALF_EPSILON * 0.4999f),
        "1 01111 0000000001",
        "1 01111111 00000000010000000000000");
    testBits (
        -(1.0f + HALF_EPSILON + HALF_EPSILON * 0.5001f),
        "1 01111 0000000010",
        "1 01111111 00000000100000000000000");
    testBits (
        -(1.0f - HALF_EPSILON * 0.5f),
        "1 01110 1111111111",
        "1 01111110 11111111110000000000000");
    testBits (
        -(1.0f - HALF_EPSILON * 0.5f * 0.5f),
        "1 01111 0000000000",
        "1 01111111 00000000000000000000000");
    testBits (
        -(1.0f - HALF_EPSILON * 0.5f * 0.4999f),
        "1 01111 0000000000",
        "1 01111111 00000000000000000000000");
    testBits (
        -(1.0f - HALF_EPSILON * 0.5f * 0.5001f),
        "1 01110 1111111111",
        "1 01111110 11111111110000000000000");

    //
    // Numbers close to -HALF_DENORM_MIN
    //

    testBits (
        -HALF_DENORM_MIN,
        "1 00000 0000000001",
        "1 01100111 00000000000000000000000");
    testBits (
        -(HALF_DENORM_MIN + HALF_DENORM_MIN),
        "1 00000 0000000010",
        "1 01101000 00000000000000000000000");
    testBits (
        -(HALF_DENORM_MIN + HALF_DENORM_MIN * 0.5f),
        "1 00000 0000000010",
        "1 01101000 00000000000000000000000");
    testBits (
        -(HALF_DENORM_MIN + HALF_DENORM_MIN * 0.4999f),
        "1 00000 0000000001",
        "1 01100111 00000000000000000000000");
    testBits (
        -(HALF_DENORM_MIN + HALF_DENORM_MIN * 0.5001f),
        "1 00000 0000000010",
        "1 01101000 00000000000000000000000");
    testBits (
        -(HALF_DENORM_MIN -
          HALF_DENORM_MIN), // NOSONAR - suppress SonarCloud bug report.
        "X 00000 0000000000",
        "X 00000000 00000000000000000000000");
    testBits (
        -(HALF_DENORM_MIN - HALF_DENORM_MIN * 0.5f),
        "1 00000 0000000000",
        "1 00000000 00000000000000000000000");
    testBits (
        -(HALF_DENORM_MIN - HALF_DENORM_MIN * 0.4999f),
        "1 00000 0000000001",
        "1 01100111 00000000000000000000000");
    testBits (
        -(HALF_DENORM_MIN - HALF_DENORM_MIN * 0.5001f),
        "1 00000 0000000000",
        "1 00000000 00000000000000000000000");

    //
    // Numbers close to -HALF_NRM_MIN
    //

    testBits (
        -HALF_NRM_MIN,
        "1 00001 0000000000",
        "1 01110001 00000000000000000000000");
    testBits (
        -(HALF_NRM_MIN + HALF_DENORM_MIN),
        "1 00001 0000000001",
        "1 01110001 00000000010000000000000");
    testBits (
        -(HALF_NRM_MIN + HALF_DENORM_MIN * 0.5f),
        "1 00001 0000000000",
        "1 01110001 00000000000000000000000");
    testBits (
        -(HALF_NRM_MIN + HALF_DENORM_MIN * 0.4999f),
        "1 00001 0000000000",
        "1 01110001 00000000000000000000000");
    testBits (
        -(HALF_NRM_MIN + HALF_DENORM_MIN * 0.5001f),
        "1 00001 0000000001",
        "1 01110001 00000000010000000000000");
    testBits (
        -(HALF_NRM_MIN - HALF_DENORM_MIN),
        "1 00000 1111111111",
        "1 01110000 11111111100000000000000");
    testBits (
        -(HALF_NRM_MIN - HALF_DENORM_MIN * 0.5f),
        "1 00001 0000000000",
        "1 01110001 00000000000000000000000");
    testBits (
        -(HALF_NRM_MIN - HALF_DENORM_MIN * 0.49995f),
        "1 00001 0000000000",
        "1 01110001 00000000000000000000000");
    testBits (
        -(HALF_NRM_MIN - HALF_DENORM_MIN * 0.50005f),
        "1 00000 1111111111",
        "1 01110000 11111111100000000000000");

    //
    // Small negative integers and simple decimal fractions
    //

    testBits (-2, "1 10000 0000000000", "1 10000000 00000000000000000000000");
    testBits (-3, "1 10000 1000000000", "1 10000000 10000000000000000000000");
    testBits (-10, "1 10010 0100000000", "1 10000010 01000000000000000000000");
    testBits (
        -0.1f, "1 01011 1001100110", "1 01111011 10011001100000000000000");
    testBits (
        -0.2f, "1 01100 1001100110", "1 01111100 10011001100000000000000");
    testBits (
        -0.3f, "1 01101 0011001101", "1 01111101 00110011010000000000000");

    //
    // Numbers close to -HALF_MAX
    //

    testBits (
        -HALF_MAX, "1 11110 1111111111", "1 10001110 11111111110000000000000");
    testBits (
        -(1 << HALF_MAX_EXP) * 1.0f,
        "1 11111 0000000000",                  // +infinity
        "1 11111111 00000000000000000000000"); // +infinity
    testBits (
        -(1 << HALF_MAX_EXP) * (1.0f - HALF_EPSILON * 0.25f),
        "1 11111 0000000000",                  // +infinity
        "1 11111111 00000000000000000000000"); // +infinity
    testBits (
        -(1 << HALF_MAX_EXP) * (1.0f - HALF_EPSILON * 0.25005f),
        "1 11110 1111111111",
        "1 10001110 11111111110000000000000");
    testBits (
        -(1 << HALF_MAX_EXP) * (1.0f - HALF_EPSILON * 0.24995f),
        "1 11111 0000000000",                  // +infinity
        "1 11111111 00000000000000000000000"); // +infinity

    //
    // Large negative numbers, negative infinity and NANs
    //

    testBits (
        -HALF_MAX * HALF_MAX,
        "1 11111 0000000000",                  // +infinity
        "1 11111111 00000000000000000000000"); // +infinity
    testBits (
        -FLT_MAX,
        "1 11111 0000000000",                  // +infinity
        "1 11111111 00000000000000000000000"); // +infinity
    testBits (
        floatNegInfinity (),
        "1 11111 0000000000",                  // +infinity
        "1 11111111 00000000000000000000000"); // +infinity
    testBits (
        floatNegQNan1 (),
        "1 11111 1111111111",                  // nan
        "1 11111111 11111111110000000000000"); // nan
    testBits (
        floatNegQNan2 (),
        "1 11111 1010101010",                  // nan
        "1 11111111 10101010100000000000000"); // nan

    cout << "ok\n\n" << flush;
}